

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_node __thiscall pugi::xml_node::append_copy(xml_node *this,xml_node *proto)

{
  ulong uVar1;
  xml_allocator *this_00;
  size_t sVar2;
  xml_node_struct *pxVar3;
  xml_node_struct *pxVar4;
  xml_memory_page *in_RAX;
  xml_node_struct *pxVar5;
  uint uVar6;
  uint uVar7;
  xml_memory_page *local_28;
  
  if (proto->_root == (xml_node_struct *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar7 = (uint)proto->_root->header & 0xf;
  }
  pxVar5 = this->_root;
  if (pxVar5 != (xml_node_struct *)0x0) {
    if (uVar7 < 2) {
      return (xml_node)(xml_node_struct *)0x0;
    }
    uVar6 = (uint)pxVar5->header & 0xf;
    if (uVar6 - 3 < 0xfffffffe) {
      return (xml_node)(xml_node_struct *)0x0;
    }
    if (uVar7 - 9 < 0xfffffffe || uVar6 == 1) {
      this_00 = *(xml_allocator **)((long)pxVar5 - (pxVar5->header >> 8));
      sVar2 = this_00->_busy_size;
      uVar1 = sVar2 + 0x40;
      if (uVar1 < 0x7fd9) {
        local_28 = this_00->_root;
        this_00->_busy_size = uVar1;
        pxVar5 = (xml_node_struct *)((long)&local_28[1].allocator + sVar2);
      }
      else {
        local_28 = in_RAX;
        pxVar5 = (xml_node_struct *)
                 impl::anon_unknown_0::xml_allocator::allocate_memory_oob(this_00,0x40,&local_28);
        if (pxVar5 == (xml_node_struct *)0x0) {
          return (xml_node)(xml_node_struct *)0x0;
        }
      }
      pxVar5->first_child = (xml_node_struct *)0x0;
      pxVar5->prev_sibling_c = (xml_node_struct *)0x0;
      pxVar5->next_sibling = (xml_node_struct *)0x0;
      pxVar5->first_attribute = (xml_attribute_struct *)0x0;
      pxVar5->name = (char_t *)0x0;
      pxVar5->value = (char_t *)0x0;
      pxVar5->parent = (xml_node_struct *)0x0;
      pxVar5->first_child = (xml_node_struct *)0x0;
      pxVar5->header = (ulong)uVar7 | ((long)pxVar5 - (long)local_28) * 0x100;
      pxVar3 = this->_root;
      pxVar5->parent = pxVar3;
      pxVar4 = pxVar3->first_child;
      if (pxVar4 == (xml_node_struct *)0x0) {
        pxVar3->first_child = pxVar5;
        pxVar4 = pxVar5;
      }
      else {
        pxVar3 = pxVar4->prev_sibling_c;
        pxVar3->next_sibling = pxVar5;
        pxVar5->prev_sibling_c = pxVar3;
      }
      pxVar4->prev_sibling_c = pxVar5;
      impl::anon_unknown_0::node_copy_tree(pxVar5,proto->_root);
      return (xml_node)pxVar5;
    }
  }
  return (xml_node)(xml_node_struct *)0x0;
}

Assistant:

PUGI__FN xml_node xml_node::append_copy(const xml_node& proto)
	{
		xml_node_type type_ = proto.type();
		if (!impl::allow_insert_child(type(), type_)) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		xml_node n(impl::allocate_node(alloc, type_));
		if (!n) return xml_node();

		impl::append_node(n._root, _root);
		impl::node_copy_tree(n._root, proto._root);

		return n;
	}